

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ht.c
# Opt level: O0

int lgx_ht_init(lgx_ht_t *ht,uint size)

{
  int iVar1;
  lgx_ht_node_t **pplVar2;
  bool bVar3;
  uint local_1c;
  uint size_local;
  lgx_ht_t *ht_local;
  
  memset(ht,0,0x20);
  iVar1 = 0x1f;
  if (size - 1 != 0) {
    for (; size - 1 >> iVar1 == 0; iVar1 = iVar1 + -1) {
    }
  }
  local_1c = (uint)(0x100000000 >> (((byte)iVar1 ^ 0x1f) & 0x3f));
  if (local_1c < 8) {
    local_1c = 8;
  }
  pplVar2 = (lgx_ht_node_t **)calloc((ulong)local_1c,8);
  ht->table = pplVar2;
  bVar3 = ht->table != (lgx_ht_node_t **)0x0;
  if (bVar3) {
    ht->length = 0;
    ht->size = local_1c;
  }
  ht_local._4_4_ = (uint)!bVar3;
  return ht_local._4_4_;
}

Assistant:

int lgx_ht_init(lgx_ht_t* ht, unsigned size) {
    memset(ht, 0, sizeof(lgx_ht_t));
    
    // 规范化 size 取值
    size = ALIGN(size);
    if (size < LGX_HT_MIN_SIZE) {
        size = LGX_HT_MIN_SIZE;
    }

    ht->table = (lgx_ht_node_t **)xcalloc(size, sizeof(lgx_ht_node_t*));
    if (UNEXPECTED(!ht->table)) {
        return 1;
    }

    ht->length = 0;
    ht->size = size;

    return 0;
}